

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

optional<unsigned_int> __thiscall
slang::ast::ConditionalExpression::getEffectiveWidthImpl(ConditionalExpression *this)

{
  _Optional_base<unsigned_int,_true,_true> _Var1;
  optional<unsigned_int> oVar2;
  
  _Var1._M_payload.super__Optional_payload_base<unsigned_int> =
       (_Optional_payload<unsigned_int,_true,_true,_true>)Expression::getEffectiveWidth(this->left_)
  ;
  oVar2 = Expression::getEffectiveWidth(this->right_);
  if ((((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) &&
     ((((ulong)_Var1._M_payload.super__Optional_payload_base<unsigned_int> & 0x100000000) == 0 ||
      (_Var1._M_payload.super__Optional_payload_base<unsigned_int>._M_payload <
       oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload)))) {
    _Var1._M_payload.super__Optional_payload_base<unsigned_int> =
         (_Optional_payload<unsigned_int,_true,_true,_true>)
         (_Optional_payload<unsigned_int,_true,_true,_true>)oVar2;
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)
         _Var1._M_payload.super__Optional_payload_base<unsigned_int>;
}

Assistant:

std::optional<bitwidth_t> ConditionalExpression::getEffectiveWidthImpl() const {
    return std::max(left().getEffectiveWidth(), right().getEffectiveWidth());
}